

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int process_frame_header(jpeg *z,int scan)

{
  int iVar1;
  int iVar2;
  uint32 uVar3;
  uint uVar4;
  void *pvVar5;
  uint local_40;
  int c;
  int v_max;
  int h_max;
  int q;
  int i;
  int p;
  int Lf;
  stbi *s;
  int scan_local;
  jpeg *z_local;
  
  c = 1;
  local_40 = 1;
  iVar1 = get16(&z->s);
  if (iVar1 < 0xb) {
    z_local._4_4_ = e("Corrupt JPEG");
  }
  else {
    iVar2 = get8(&z->s);
    if (iVar2 == 8) {
      uVar3 = get16(&z->s);
      (z->s).img_y = uVar3;
      if ((z->s).img_y == 0) {
        z_local._4_4_ = e("JPEG format not supported: delayed height");
      }
      else {
        uVar3 = get16(&z->s);
        (z->s).img_x = uVar3;
        if ((z->s).img_x == 0) {
          z_local._4_4_ = e("Corrupt JPEG");
        }
        else {
          iVar2 = get8(&z->s);
          if ((iVar2 == 3) || (iVar2 == 1)) {
            (z->s).img_n = iVar2;
            for (h_max = 0; h_max < iVar2; h_max = h_max + 1) {
              z->img_comp[h_max].data = (uint8 *)0x0;
              z->img_comp[h_max].linebuf = (uint8 *)0x0;
            }
            if (iVar1 == (z->s).img_n * 3 + 8) {
              for (h_max = 0; h_max < (z->s).img_n; h_max = h_max + 1) {
                iVar1 = get8(&z->s);
                z->img_comp[h_max].id = iVar1;
                if ((z->img_comp[h_max].id != h_max + 1) && (z->img_comp[h_max].id != h_max)) {
                  iVar1 = e("Corrupt JPEG");
                  return iVar1;
                }
                uVar4 = get8(&z->s);
                z->img_comp[h_max].h = (int)uVar4 >> 4;
                if ((z->img_comp[h_max].h == 0) || (4 < z->img_comp[h_max].h)) {
                  iVar1 = e("Corrupt JPEG");
                  return iVar1;
                }
                z->img_comp[h_max].v = uVar4 & 0xf;
                if ((z->img_comp[h_max].v == 0) || (4 < z->img_comp[h_max].v)) {
                  iVar1 = e("Corrupt JPEG");
                  return iVar1;
                }
                iVar1 = get8(&z->s);
                z->img_comp[h_max].tq = iVar1;
                if (3 < z->img_comp[h_max].tq) {
                  iVar1 = e("Corrupt JPEG");
                  return iVar1;
                }
              }
              if (scan == 0) {
                if ((uint)((0x40000000 / (ulong)(z->s).img_x) / (ulong)(uint)(z->s).img_n) <
                    (z->s).img_y) {
                  z_local._4_4_ = e("Image too large to decode");
                }
                else {
                  for (h_max = 0; h_max < (z->s).img_n; h_max = h_max + 1) {
                    if (c < z->img_comp[h_max].h) {
                      c = z->img_comp[h_max].h;
                    }
                    if ((int)local_40 < z->img_comp[h_max].v) {
                      local_40 = z->img_comp[h_max].v;
                    }
                  }
                  z->img_h_max = c;
                  z->img_v_max = local_40;
                  z->img_mcu_w = c << 3;
                  z->img_mcu_h = local_40 << 3;
                  z->img_mcu_x = (((z->s).img_x + z->img_mcu_w) - 1) / (uint)z->img_mcu_w;
                  z->img_mcu_y = (((z->s).img_y + z->img_mcu_h) - 1) / (uint)z->img_mcu_h;
                  for (h_max = 0; h_max < (z->s).img_n; h_max = h_max + 1) {
                    z->img_comp[h_max].x = (((z->s).img_x * z->img_comp[h_max].h + c) - 1) / (uint)c
                    ;
                    z->img_comp[h_max].y =
                         (((z->s).img_y * z->img_comp[h_max].v + local_40) - 1) / local_40;
                    z->img_comp[h_max].w2 = z->img_mcu_x * z->img_comp[h_max].h * 8;
                    z->img_comp[h_max].h2 = z->img_mcu_y * z->img_comp[h_max].v * 8;
                    pvVar5 = malloc((long)(z->img_comp[h_max].w2 * z->img_comp[h_max].h2 + 0xf));
                    z->img_comp[h_max].raw_data = pvVar5;
                    if (z->img_comp[h_max].raw_data == (void *)0x0) {
                      while (h_max = h_max + -1, -1 < h_max) {
                        free(z->img_comp[h_max].raw_data);
                        z->img_comp[h_max].data = (uint8 *)0x0;
                      }
                      iVar1 = e("Out of memory");
                      return iVar1;
                    }
                    z->img_comp[h_max].data =
                         (uint8 *)((long)z->img_comp[h_max].raw_data + 0xfU & 0xfffffffffffffff0);
                    z->img_comp[h_max].linebuf = (uint8 *)0x0;
                  }
                  z_local._4_4_ = 1;
                }
              }
              else {
                z_local._4_4_ = 1;
              }
            }
            else {
              z_local._4_4_ = e("Corrupt JPEG");
            }
          }
          else {
            z_local._4_4_ = e("Corrupt JPEG");
          }
        }
      }
    }
    else {
      z_local._4_4_ = e("JPEG format not supported: 8-bit only");
    }
  }
  return z_local._4_4_;
}

Assistant:

static int process_frame_header(jpeg *z, int scan)
{
   stbi *s = &z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = get16(s);         if (Lf < 11) return e("bad SOF len","Corrupt JPEG"); // JPEG
   p  = get8(s);          if (p != 8) return e("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = get16(s);   if (s->img_y == 0) return e("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = get16(s);   if (s->img_x == 0) return e("0 width","Corrupt JPEG"); // JPEG requires
   c = get8(s);
   if (c != 3 && c != 1) return e("bad component count","Corrupt JPEG");    // JFIF requires
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return e("bad SOF len","Corrupt JPEG");

   for (i=0; i < s->img_n; ++i) {
      z->img_comp[i].id = get8(s);
      if (z->img_comp[i].id != i+1)   // JFIF requires
         if (z->img_comp[i].id != i)  // some version of jpegtran outputs non-JFIF-compliant files!
            return e("bad component ID","Corrupt JPEG");
      q = get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return e("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return e("bad V","Corrupt JPEG");
      z->img_comp[i].tq = get8(s);  if (z->img_comp[i].tq > 3) return e("bad TQ","Corrupt JPEG");
   }

   if (scan != SCAN_load) return 1;

   if ((1 << 30) / s->img_x / s->img_n < s->img_y) return e("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].raw_data = malloc(z->img_comp[i].w2 * z->img_comp[i].h2+15);
      if (z->img_comp[i].raw_data == NULL) {
         for(--i; i >= 0; --i) {
            free(z->img_comp[i].raw_data);
            z->img_comp[i].data = NULL;
         }
         return e("outofmem", "Out of memory");
      }
      // align blocks for installable-idct using mmx/sse
      z->img_comp[i].data = (uint8*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      z->img_comp[i].linebuf = NULL;
   }

   return 1;
}